

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

NumericValue xe::getNumericValue(string *value)

{
  long lVar1;
  char *pcVar2;
  NumericValue NVar3;
  undefined8 uStack_1c0;
  allocator<char> local_1a9;
  anon_union_8_2_07d0b834_for_m_value local_1a8 [4];
  istringstream s;
  
  lVar1 = std::__cxx11::string::find((char)value,0x2e);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char)value,0x65);
    if (lVar1 == -1) {
      pcVar2 = stripLeadingWhitespace((value->_M_dataplus)._M_p);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,pcVar2,&local_1a9);
      std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)local_1a8,_S_in);
      std::__cxx11::string::~string((string *)local_1a8);
      std::istream::_M_extract<long>((long *)&s);
      std::__cxx11::istringstream::~istringstream((istringstream *)&s);
      uStack_1c0 = 1;
      goto LAB_001306a7;
    }
  }
  pcVar2 = stripLeadingWhitespace((value->_M_dataplus)._M_p);
  local_1a8[0].float64 = atof(pcVar2);
  uStack_1c0 = 2;
LAB_001306a7:
  NVar3.m_value.int64 = local_1a8[0].int64;
  NVar3._0_8_ = uStack_1c0;
  return NVar3;
}

Assistant:

static ri::NumericValue getNumericValue (const std::string& value)
{
	const bool	isFloat		= value.find('.') != std::string::npos || value.find('e') != std::string::npos;

	if (isFloat)
	{
		const double num = toDouble(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
	else
	{
		const deInt64 num = toInt64(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
}